

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptDate.cpp
# Opt level: O0

double Js::JavascriptDate::TimeClip(Var x)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double dVar4;
  Var local_20;
  double time;
  Var x_local;
  
  bVar2 = TaggedInt::Is(x);
  if (bVar2) {
    local_20 = (Var)TaggedInt::ToDouble(x);
  }
  else {
    bVar2 = JavascriptNumber::Is(x);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptDate.cpp"
                                  ,0xe7,"(JavascriptNumber::Is(x))","JavascriptNumber::Is(x)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar3 = 0;
    }
    dVar4 = JavascriptNumber::GetValue(x);
    bVar2 = NumberUtilities::IsFinite(dVar4);
    if (!bVar2) {
      return NumberConstants::NaN;
    }
    local_20 = (Var)JavascriptConversion::ToInteger(dVar4);
  }
  dVar4 = Math::Abs((double)local_20);
  if (dVar4 <= 8.64e+15) {
    x_local = local_20;
  }
  else {
    x_local = (Var)NumberConstants::NaN;
  }
  return (double)x_local;
}

Assistant:

double JavascriptDate::TimeClip(Var x)
    {
        double time = 0.0;
        if (TaggedInt::Is(x))
        {
            time = TaggedInt::ToDouble(x);
        }
        else
        {
            AssertOrFailFast(JavascriptNumber::Is(x));
            time = JavascriptNumber::GetValue(x);

            // Only perform steps 1, 3, and 4 if the input was not a TaggedInt, since TaggedInts cant be infinite or -0
            if (!NumberUtilities::IsFinite(time))
            {
                return NumberConstants::NaN;
            }

            // This performs both steps 3 and 4
            time = JavascriptConversion::ToInteger(time);
        }

        // Step 2: If abs(time) > 8.64e15, return NaN.
        if (Math::Abs(time) > 8.64e15)
        {
            return NumberConstants::NaN;
        }

        return time;
    }